

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

ActionResult __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckAction(ScriptValidator *this,Action *action)

{
  Module *pMVar1;
  Export *pEVar2;
  Func *pFVar3;
  Global *pGVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  anon_union_8_2_516a9242_for_ActionResult_2 aVar9;
  ActionResult AVar10;
  string_view name;
  string_view name_00;
  
  if (*(int *)(action + 0x90) == 1) {
    pMVar1 = Script::GetModule(this->script_,(Var *)(action + 0x28));
    if (pMVar1 == (Module *)0x0) {
      PrintError(this,(Location *)(action + 8),"unknown module");
    }
    else {
      name_00._M_str = *(char **)(action + 0x70);
      name_00._M_len = *(size_t *)(action + 0x78);
      pEVar2 = Module::GetExport(pMVar1,name_00);
      if (pEVar2 == (Export *)0x0) {
        PrintError(this,(Location *)(action + 8),"unknown global export \"%s\"",
                   *(undefined8 *)(action + 0x70));
      }
      else {
        pGVar4 = Module::GetGlobal(pMVar1,&pEVar2->var);
        if (pGVar4 != (Global *)0x0) {
          aVar9 = (anon_union_8_2_516a9242_for_ActionResult_2)
                  *(anon_union_8_2_516a9242_for_ActionResult_2 *)&pGVar4->type;
          uVar6 = 2;
          goto LAB_001355a9;
        }
      }
    }
  }
  else if (*(int *)(action + 0x90) == 0) {
    pMVar1 = Script::GetModule(this->script_,(Var *)(action + 0x28));
    if (pMVar1 == (Module *)0x0) {
      aVar9.types = (TypeVector *)0x0;
      PrintError(this,(Location *)(action + 8),"unknown module");
    }
    else {
      name._M_str = *(char **)(action + 0x70);
      name._M_len = *(size_t *)(action + 0x78);
      pEVar2 = Module::GetExport(pMVar1,name);
      if (pEVar2 == (Export *)0x0) {
        aVar9.types = (TypeVector *)0x0;
        PrintError(this,(Location *)(action + 8),"unknown function export \"%s\"",
                   *(undefined8 *)(action + 0x70));
      }
      else {
        pFVar3 = Module::GetFunc(pMVar1,&pEVar2->var);
        if (pFVar3 == (Func *)0x0) {
          aVar9.types = (TypeVector *)0x0;
        }
        else {
          uVar7 = (*(long *)(action + 0xa0) - *(long *)(action + 0x98) >> 4) * -0x3333333333333333;
          uVar6 = (ulong)((long)(pFVar3->decl).sig.param_types.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pFVar3->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
          if (uVar7 - uVar6 == 0) {
            if (*(long *)(action + 0xa0) != *(long *)(action + 0x98)) {
              lVar8 = 0;
              uVar6 = 0;
              do {
                CheckTypeIndex(this,(Location *)(*(long *)(action + 0x98) + lVar8),
                               *(Type *)(*(long *)(action + 0x98) + 0x20 + lVar8),
                               (pFVar3->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar6 & 0xffffffff],"invoke",
                               (Index)uVar6,"argument");
                uVar6 = uVar6 + 1;
                lVar8 = lVar8 + 0x50;
              } while (uVar7 + (uVar7 == 0) != uVar6);
            }
            aVar9.types = &(pFVar3->decl).sig.result_types;
          }
          else {
            pcVar5 = "few";
            if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
              pcVar5 = "many";
            }
            aVar9.types = (TypeVector *)0x0;
            PrintError(this,(Location *)(action + 8),
                       "too %s parameters to function. got %zd, expected %zd",pcVar5,uVar7);
          }
        }
      }
    }
    uVar6 = (ulong)((Type)aVar9.types != (Type)0x0);
    goto LAB_001355a9;
  }
  uVar6 = 0;
  aVar9.types = (TypeVector *)0x0;
LAB_001355a9:
  AVar10.field_1.types = aVar9.types;
  AVar10._0_8_ = uVar6;
  return AVar10;
}

Assistant:

ScriptValidator::ActionResult ScriptValidator::CheckAction(
    const Action* action) {
  ActionResult result;
  ZeroMemory(result);

  switch (action->type()) {
    case ActionType::Invoke:
      result.types = CheckInvoke(cast<InvokeAction>(action));
      result.kind =
          result.types ? ActionResult::Kind::Types : ActionResult::Kind::Error;
      break;

    case ActionType::Get:
      if (Succeeded(CheckGet(cast<GetAction>(action), &result.type))) {
        result.kind = ActionResult::Kind::Type;
      } else {
        result.kind = ActionResult::Kind::Error;
      }
      break;
  }

  return result;
}